

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O1

Vector3d *
RigidBodyDynamics::CalcBaseToBodyCoordinates
          (Vector3d *__return_storage_ptr__,Model *model,VectorNd *Q,uint body_id,
          Vector3d *point_base_coordinates,bool update_kinematics)

{
  uint uVar1;
  pointer pSVar2;
  pointer pFVar3;
  uint uVar4;
  long lVar5;
  SpatialTransform *pSVar6;
  pointer pSVar7;
  undefined8 *puVar8;
  undefined8 **ppuVar9;
  undefined7 in_register_00000089;
  byte bVar10;
  Vector3d parent_body_position;
  Vector3d fixed_position;
  Vector3d body_position;
  Matrix3d parent_body_rotation;
  Matrix3d body_rotation;
  undefined8 local_138;
  double dStack_130;
  double local_128;
  undefined8 local_118;
  double dStack_110;
  double local_108;
  undefined8 *local_f8;
  double dStack_f0;
  undefined8 *local_e8;
  undefined8 **local_d8;
  undefined1 *local_d0;
  Vector3d *local_c8;
  undefined8 *local_b0;
  Vector3d *local_a8;
  undefined8 **local_a0;
  undefined8 local_68 [9];
  
  bVar10 = 0;
  if ((int)CONCAT71(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  uVar4 = body_id - model->fixed_body_discriminator;
  if (body_id < model->fixed_body_discriminator) {
    pSVar2 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = local_68;
    pSVar7 = pSVar2 + body_id;
    puVar8 = local_b0;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *(undefined8 *)&(pSVar7->E).super_Matrix3d;
      pSVar7 = (pointer)((long)pSVar7 + ((ulong)bVar10 * -2 + 1) * 8);
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    local_e8 = *(undefined8 **)((long)&pSVar2[body_id].r.super_Vector3d + 0x10);
    local_a0 = &local_f8;
    local_f8 = *(undefined8 **)
                &pSVar2[body_id].r.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    dStack_f0 = *(double *)
                 ((long)&pSVar2[body_id].r.super_Vector3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    local_a8 = point_base_coordinates;
    Vector3_t::
    Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              (__return_storage_ptr__,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&local_b0);
  }
  else {
    pFVar3 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = pFVar3[uVar4].mMovableParent;
    local_f8 = local_68;
    pSVar6 = &pFVar3[uVar4].mParentTransform;
    puVar8 = local_f8;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *(undefined8 *)&(pSVar6->E).super_Matrix3d;
      pSVar6 = (SpatialTransform *)((long)pSVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    local_108 = *(double *)((long)&pFVar3[uVar4].mParentTransform.r + 0x10);
    local_e8 = &local_118;
    local_118 = *(undefined8 *)
                 &pFVar3[uVar4].mParentTransform.r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    dStack_110 = *(double *)((long)&pFVar3[uVar4].mParentTransform.r + 8);
    pSVar2 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d8 = &local_b0;
    pSVar7 = pSVar2 + uVar1;
    ppuVar9 = local_d8;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *ppuVar9 = *(undefined8 **)&(pSVar7->E).super_Matrix3d;
      pSVar7 = (pointer)((long)pSVar7 + ((ulong)bVar10 * -2 + 1) * 8);
      ppuVar9 = ppuVar9 + (ulong)bVar10 * -2 + 1;
    }
    local_128 = *(double *)((long)&pSVar2[uVar1].r.super_Vector3d + 0x10);
    local_138 = *(undefined8 *)
                 &pSVar2[uVar1].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    dStack_130 = *(double *)
                  ((long)&pSVar2[uVar1].r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    local_d0 = (undefined1 *)&local_138;
    local_c8 = point_base_coordinates;
    Vector3_t::
    Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>const>,0>>
              (__return_storage_ptr__,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>,_0>_>
                *)&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI
Vector3d CalcBaseToBodyCoordinates (
		Model &model,
		const VectorNd &Q,
		unsigned int body_id,
		const Vector3d &point_base_coordinates,
		bool update_kinematics) {
	if (update_kinematics) {
		UpdateKinematicsCustom (model, &Q, NULL, NULL);
	}

	if (body_id >= model.fixed_body_discriminator) {
		unsigned int fbody_id = body_id - model.fixed_body_discriminator;
		unsigned int parent_id = model.mFixedBodies[fbody_id].mMovableParent;

		Matrix3d fixed_rotation = model.mFixedBodies[fbody_id].mParentTransform.E;
		Vector3d fixed_position = model.mFixedBodies[fbody_id].mParentTransform.r;

		Matrix3d parent_body_rotation = model.X_base[parent_id].E;
		Vector3d parent_body_position = model.X_base[parent_id].r;

		return fixed_rotation * ( - fixed_position - parent_body_rotation * (parent_body_position - point_base_coordinates));
	}

	Matrix3d body_rotation = model.X_base[body_id].E;
	Vector3d body_position = model.X_base[body_id].r;

	return body_rotation * (point_base_coordinates - body_position);
}